

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

bool __thiscall r_comp::Compiler::read_sys_object(Compiler *this,Ptr *node,Ptr *view)

{
  Class *pCVar1;
  string *psVar2;
  element_type *peVar3;
  undefined8 uVar4;
  pointer ppSVar5;
  pointer ppSVar6;
  Metadata *pMVar7;
  pointer psVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Image *this_01;
  char cVar9;
  byte bVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  const_iterator cVar14;
  iterator iVar15;
  SysObject *pSVar16;
  mapped_type *pmVar17;
  Atom *this_02;
  long *plVar18;
  SysView *this_03;
  long *plVar19;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_04;
  pointer pcVar20;
  pointer psVar21;
  string label;
  uint16_t extent_index_1;
  string label_1;
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  char local_1e0 [16];
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_1d0;
  ReturnType local_1b8;
  Iteration IStack_1b4;
  Atom local_1b0 [8];
  _Alloc_hider local_1a8;
  char local_198 [16];
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_188;
  ReturnType local_170;
  Iteration IStack_16c;
  Ptr local_168;
  Ptr local_158;
  Ptr local_148;
  Ptr local_138;
  Ptr local_128;
  Ptr local_118;
  Ptr local_108;
  Ptr local_f8;
  Ptr local_e8;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *local_d8;
  string local_d0;
  Class local_b0;
  key_type local_68;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_48;
  
  if (((node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type ==
      Structure) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&(this->local_references)._M_h);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->hlp_references);
    iVar12 = std::__cxx11::string::compare
                       ((char *)&((node->
                                  super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->label);
    this->in_hlp = false;
    peVar3 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((peVar3->args).
        super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (peVar3->args).
        super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      cVar14 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)this->_metadata,&peVar3->cmd);
      if (cVar14.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_b0,"error: unknown class \'",
                       &((node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
                        ._M_ptr)->cmd);
        plVar18 = (long *)std::__cxx11::string::append((char *)&local_b0);
        plVar19 = plVar18 + 2;
        if ((long *)*plVar18 == plVar19) {
          local_1f0._0_8_ = *plVar19;
          local_1f0._8_8_ = plVar18[3];
          local_200._0_8_ = local_200 + 0x10;
        }
        else {
          local_1f0._0_8_ = *plVar19;
          local_200._0_8_ = (long *)*plVar18;
        }
        local_200._8_8_ = plVar18[1];
        *plVar18 = (long)plVar19;
        plVar18[1] = 0;
        *(undefined1 *)(plVar18 + 2) = 0;
        local_118.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_118.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_118.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_118.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_118.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_118.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_118.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        set_error(this,(string *)local_200,&local_118);
        if (local_118.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_118.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
          operator_delete((void *)local_200._0_8_);
        }
        pCVar1 = &local_b0;
      }
      else {
        iVar15 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)this->_metadata,
                        &((node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->cmd);
        pCVar1 = &this->current_class;
        r_code::Atom::operator=
                  (&pCVar1->atom,
                   (Atom *)((long)iVar15.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                                  ._M_cur + 0x28));
        psVar2 = &(this->current_class).str_opcode;
        std::__cxx11::string::_M_assign((string *)psVar2);
        local_d8 = &(this->current_class).things_to_read;
        std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::operator=
                  (local_d8,(vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                             *)((long)iVar15.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                                      ._M_cur + 0x50));
        uVar4 = *(undefined8 *)
                 ((long)iVar15.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                        ._M_cur + 0x68);
        (this->current_class).type = (int)uVar4;
        (this->current_class).use_as = (int)((ulong)uVar4 >> 0x20);
        iVar13 = std::__cxx11::string::compare((char *)psVar2);
        if ((iVar13 == 0) || (iVar13 = std::__cxx11::string::compare((char *)psVar2), iVar13 == 0))
        {
          this->in_hlp = true;
        }
        pSVar16 = (SysObject *)operator_new(0x70);
        r_code::SysObject::SysObject(pSVar16);
        this->current_object = (ImageObject *)pSVar16;
        if (iVar12 != 0) {
          std::__cxx11::string::substr
                    ((ulong)&local_68,
                     (ulong)&((node->
                              super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->label);
          ppSVar5 = (this->_image->code_segment).objects.m_vector.
                    super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppSVar6 = (this->_image->code_segment).objects.m_vector.
                    super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          Class::Class(&local_b0,ANY);
          Reference::Reference
                    ((Reference *)local_200,(long)ppSVar6 - (long)ppSVar5 >> 3,pCVar1,&local_b0);
          pmVar17 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->_metadata->global_references,&local_68);
          pmVar17->index = local_200._0_8_;
          r_code::Atom::operator=(&(pmVar17->_class).atom,(Atom *)(local_200 + 8));
          std::__cxx11::string::operator=
                    ((string *)&(pmVar17->_class).str_opcode,(string *)(local_200 + 0x10));
          local_48.
          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pmVar17->_class).things_to_read.
               super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_48.
          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pmVar17->_class).things_to_read.
               super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_48.
          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pmVar17->_class).things_to_read.
               super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          (pmVar17->_class).things_to_read.
          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
          _M_impl.super__Vector_impl_data._M_start =
               local_1d0.
               super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
               ._M_impl.super__Vector_impl_data._M_start;
          (pmVar17->_class).things_to_read.
          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_1d0.
               super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          (pmVar17->_class).things_to_read.
          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               local_1d0.
               super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_1d0.
          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1d0.
          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1d0.
          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                    (&local_48);
          (pmVar17->_class).type = local_1b8;
          (pmVar17->_class).use_as = IStack_1b4;
          r_code::Atom::operator=(&(pmVar17->cast_class).atom,local_1b0);
          std::__cxx11::string::operator=
                    ((string *)&(pmVar17->cast_class).str_opcode,(string *)&local_1a8);
          local_48.
          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pmVar17->cast_class).things_to_read.
               super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_48.
          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pmVar17->cast_class).things_to_read.
               super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_48.
          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pmVar17->cast_class).things_to_read.
               super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          (pmVar17->cast_class).things_to_read.
          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
          _M_impl.super__Vector_impl_data._M_start =
               local_188.
               super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
               ._M_impl.super__Vector_impl_data._M_start;
          (pmVar17->cast_class).things_to_read.
          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_188.
               super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          (pmVar17->cast_class).things_to_read.
          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               local_188.
               super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_188.
          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_188.
          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_188.
          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                    (&local_48);
          (pmVar17->cast_class).type = local_170;
          (pmVar17->cast_class).use_as = IStack_16c;
          std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                    (&local_188);
          if (local_1a8._M_p != local_198) {
            operator_delete(local_1a8._M_p);
          }
          r_code::Atom::~Atom(local_1b0);
          std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                    (&local_1d0);
          if ((char *)local_1f0._0_8_ != local_1e0) {
            operator_delete((void *)local_1f0._0_8_);
          }
          r_code::Atom::~Atom((Atom *)(local_200 + 8));
          std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                    (&local_b0.things_to_read);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0.str_opcode._M_dataplus._M_p != &local_b0.str_opcode.field_2) {
            operator_delete(local_b0.str_opcode._M_dataplus._M_p);
          }
          r_code::Atom::~Atom(&local_b0.atom);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p);
          }
          pSVar16 = (SysObject *)this->current_object;
        }
        this_02 = r_code::vector<r_code::Atom>::operator[]((vector<r_code::Atom> *)(pSVar16 + 8),0);
        r_code::Atom::operator=(this_02,&pCVar1->atom);
        cVar9 = r_code::Atom::getAtomCount();
        if (cVar9 != '\0') {
          bVar10 = r_code::Atom::getAtomCount();
          local_200._0_2_ = bVar10 + 1;
          local_128.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_128.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
          if (local_128.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_128.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_128.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_128.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_128.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          bVar11 = expression_tail(this,&local_128,pCVar1,1,(uint16_t *)local_200,true);
          if (local_128.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_128.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (!bVar11) {
            return false;
          }
        }
        pSVar16 = (SysObject *)this->current_object;
        peVar3 = (view->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if ((peVar3->args).
            super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (peVar3->args).
            super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          if ((peVar3->type == Atom) ||
             (iVar12 = std::__cxx11::string::compare((char *)&peVar3->cmd), iVar12 == 0)) {
LAB_00125ae6:
            if (this->trace == true) {
              (**(code **)(*(long *)pSVar16 + 0x20))(pSVar16);
            }
            std::__cxx11::string::substr
                      ((ulong)local_200,
                       (ulong)&((node->
                                super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr)->label);
            this_01 = this->_image;
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,local_200._0_8_,
                       (pointer)(local_200._0_8_ + local_200._8_8_));
            Image::add_sys_object(this_01,pSVar16,&local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
              operator_delete((void *)local_200._0_8_);
            }
            return true;
          }
          local_200._0_8_ = local_200 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_200,"expected a view set","");
          local_168.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (view->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_168.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (view->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
          if (local_168.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_168.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_168.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_168.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_168.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          set_error(this,(string *)local_200,&local_168);
          if (local_168.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_168.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          pcVar20 = (pointer)local_200._0_8_;
          if ((undefined1 *)local_200._0_8_ == local_200 + 0x10) {
            return false;
          }
          goto LAB_001254d7;
        }
        if (peVar3->type == Set) {
          iVar12 = std::__cxx11::string::compare((char *)psVar2);
          if (iVar12 == 0) {
            pMVar7 = this->_metadata;
            local_200._0_8_ = local_200 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"grp_view","");
            iVar15 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)pMVar7,(key_type *)local_200);
            r_code::Atom::operator=
                      (&pCVar1->atom,
                       (Atom *)((long)iVar15.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                                      ._M_cur + 0x28));
            std::__cxx11::string::_M_assign((string *)psVar2);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
            operator=(local_d8,(vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                                *)((long)iVar15.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                                         ._M_cur + 0x50));
            uVar4 = *(undefined8 *)
                     ((long)iVar15.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                            ._M_cur + 0x68);
            (this->current_class).type = (int)uVar4;
            (this->current_class).use_as = (int)((ulong)uVar4 >> 0x20);
          }
          else {
            iVar12 = std::__cxx11::string::compare((char *)psVar2);
            if ((((iVar12 == 0) ||
                 (iVar12 = std::__cxx11::string::compare((char *)psVar2), iVar12 == 0)) ||
                (iVar12 = std::__cxx11::string::compare((char *)psVar2), iVar12 == 0)) ||
               (iVar12 = std::__cxx11::string::compare((char *)psVar2), iVar12 == 0)) {
              pMVar7 = this->_metadata;
              local_200._0_8_ = local_200 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"pgm_view","");
              iVar15 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)pMVar7,(key_type *)local_200);
              Class::operator=(pCVar1,(Class *)((long)iVar15.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                                                  ._M_cur + 0x28));
            }
            else {
              pMVar7 = this->_metadata;
              local_200._0_8_ = local_200 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"view","");
              iVar15 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)pMVar7,(key_type *)local_200);
              Class::operator=(pCVar1,(Class *)((long)iVar15.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                                                  ._M_cur + 0x28));
            }
          }
          if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
            operator_delete((void *)local_200._0_8_);
          }
          (this->current_class).use_as = I_CLASS;
          peVar3 = (view->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          psVar21 = (peVar3->args).
                    super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar8 = (peVar3->args).
                   super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (psVar21 != psVar8) {
            do {
              peVar3 = (psVar21->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              this_00 = (psVar21->
                        super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount._M_pi;
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                }
              }
              this_03 = (SysView *)operator_new(0x38);
              r_code::SysView::SysView(this_03);
              this->current_object = (ImageObject *)this_03;
              local_b0.atom = (Atom)0x0;
              local_b0._1_1_ = 0;
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                }
              }
              local_148.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   peVar3;
              local_148.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = this_00;
              bVar11 = read_set(this,&local_148,true,pCVar1,0,(uint16_t *)&local_b0,true);
              if (local_148.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_148.
                           super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (bVar11) {
                r_code::vector<r_code::SysView_*>::push_back
                          ((vector<r_code::SysView_*> *)(pSVar16 + 0x50),
                           (SysView *)this->current_object);
              }
              else {
                local_200._0_8_ = local_200 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_200," error: illegal element in set","");
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                  }
                }
                local_158.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = peVar3;
                local_158.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = this_00;
                set_error(this,(string *)local_200,&local_158);
                if (local_158.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_158.
                             super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
                  operator_delete((void *)local_200._0_8_);
                }
                if (this->current_object != (ImageObject *)0x0) {
                  (**(code **)(*(long *)this->current_object + 8))();
                }
              }
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              }
              if (!bVar11) {
                return false;
              }
              psVar21 = psVar21 + 1;
            } while (psVar21 != psVar8);
          }
          goto LAB_00125ae6;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_200,"expected a view set, got ",&peVar3->cmd);
        local_138.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (view->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_138.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (view->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_138.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_138.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_138.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_138.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_138.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        set_error(this,(string *)local_200,&local_138);
        if (local_138.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_138.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        pCVar1 = (Class *)local_200;
      }
      pcVar20 = *(pointer *)pCVar1;
      if ((size_type *)*(pointer *)pCVar1 == &(pCVar1->str_opcode)._M_string_length) {
        return false;
      }
      goto LAB_001254d7;
    }
    local_200._0_8_ = local_200 + 0x10;
    if (iVar12 == 0) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,"error: missing expression opening","");
      local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
      if (local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count =
               (local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count =
               (local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      set_error(this,(string *)local_200,&local_108);
      this_04._M_pi =
           local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,"error: label not followed by expression","");
      local_f8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_f8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
      if (local_f8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_f8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_f8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_f8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_f8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      set_error(this,(string *)local_200,&local_f8);
      this_04._M_pi =
           local_f8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
    }
  }
  else {
    local_200._0_8_ = local_200 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"expected expression","");
    local_e8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_e8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_e8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_e8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_e8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_e8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_e8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    set_error(this,(string *)local_200,&local_e8);
    this_04._M_pi =
         local_e8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
  }
  if (this_04._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_04._M_pi);
  }
  pcVar20 = (pointer)local_200._0_8_;
  if ((undefined1 *)local_200._0_8_ == local_200 + 0x10) {
    return false;
  }
LAB_001254d7:
  operator_delete(pcVar20);
  return false;
}

Assistant:

bool Compiler::read_sys_object(RepliStruct::Ptr node, RepliStruct::Ptr view)
{
    if (node->type != RepliStruct::Structure) {
        set_error("expected expression", node);
        return false;
    }

    local_references.clear();
    hlp_references.clear();
    bool hasLabel = node->label != "";
    in_hlp = false;

    if (node->args.size() == 0) {
        if (hasLabel) {
            set_error("error: label not followed by expression", node);
        } else {
            set_error("error: missing expression opening", node);
        }

        return false;
    }

    if (_metadata->classes.count(node->cmd) == 0) {
        set_error("error: unknown class '" + node->cmd + "'", node);
        return false;
    }

    current_class = _metadata->classes.find(node->cmd)->second;

    if (current_class.str_opcode == "mdl" || current_class.str_opcode == "cst") {
        in_hlp = true;
    }

    current_object = new SysObject();

    if (hasLabel) {
        std::string label = node->label.substr(0, node->label.size() - 1);
        _metadata->global_references[label] = Reference(_image->code_segment.objects.size(), current_class, Class());
    }

    current_object->code[0] = current_class.atom;

    if (current_class.atom.getAtomCount()) {
        uint16_t extent_index = current_class.atom.getAtomCount() + 1;

        if (!expression_tail(node, current_class, 1, extent_index, true)) {
            return false;
        }
    }

    SysObject *sys_object = (SysObject *)current_object; // current_object will point to views, if any.

    // compile view set
    // input format:
    // []
    // [view-data]
    // ...
    // [view-data]
    // or:
    // |[]

    if (view->args.size() > 0) {
        if (view->type != RepliStruct::Set) {
            set_error("expected a view set, got " + view->cmd, view);
            return false;
        }

        if (current_class.str_opcode == "grp") {
            current_class = _metadata->classes.find("grp_view")->second;
        } else if (current_class.str_opcode == "ipgm" ||
                   current_class.str_opcode == "icpp_pgm" ||
                   current_class.str_opcode == "mdl" ||
                   current_class.str_opcode == "cst") {
            current_class = _metadata->classes.find("pgm_view")->second;
        } else {
            current_class = _metadata->classes.find("view")->second;
        }

        current_class.use_as = StructureMember::I_CLASS;
        uint16_t count = 0;

        for (RepliStruct::Ptr argNode : view->args) {
            current_object = new SysView();
            uint16_t extent_index = 0;

            if (!read_set(argNode, true, &current_class, 0, extent_index, true)) {
                set_error(" error: illegal element in set", argNode);
                delete current_object;
                return false;
            }

            count++;
            sys_object->views.push_back((SysView *)current_object);
        }
    } else if (view->type != RepliStruct::Atom && view->cmd != "|[]") {
        set_error("expected a view set", view);
        return false;
    }

    if (trace) {
        sys_object->trace();
    }

    // TODO: what happens if hasLabel == false
    std::string label = node->label.substr(0, node->label.size() - 1);
    _image->add_sys_object(sys_object, label);
    return true;
}